

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image.h
# Opt level: O2

int stbi__shiftsigned(int v,int shift,int bits)

{
  int iVar1;
  int iVar2;
  byte bVar3;
  int iVar4;
  int iVar5;
  
  iVar2 = v << (-(byte)shift & 0x1f);
  iVar5 = v >> ((byte)shift & 0x1f);
  iVar4 = bits;
  iVar1 = iVar5;
  if (shift < 0) {
    iVar5 = iVar2;
    iVar1 = iVar2;
  }
  for (; iVar4 < 8; iVar4 = iVar4 + bits) {
    bVar3 = (byte)iVar4;
    iVar5 = iVar5 + (iVar1 >> (bVar3 & 0x1f));
  }
  return iVar5;
}

Assistant:

static int stbi__shiftsigned(int v, int shift, int bits)
{
   int result;
   int z=0;

   if (shift < 0) v <<= -shift;
   else v >>= shift;
   result = v;

   z = bits;
   while (z < 8) {
      result += v >> z;
      z += bits;
   }
   return result;
}